

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
hufBuildDecTable(exr_const_context_t pctxt,uint64_t *hcode,uint32_t im,uint32_t iM,HufDec *hdecod)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  undefined8 uVar6;
  sbyte sVar7;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint64_t i_1;
  HufDec *pl_1;
  uint32_t i;
  uint32_t *p;
  HufDec *pl;
  int l;
  uint64_t c;
  _func_void_void_ptr *free_fn;
  _func_void_ptr_size_t *alloc_fn;
  code *local_80;
  code *local_78;
  long local_70;
  uint *local_68;
  uint local_5c;
  uint local_1c;
  
  local_1c = in_EDX;
  if (in_RDI == 0) {
    local_78 = internal_exr_alloc;
    local_80 = internal_exr_free;
  }
  else {
    local_78 = *(code **)(in_RDI + 0x58);
    local_80 = *(code **)(in_RDI + 0x60);
  }
  do {
    if (in_ECX < local_1c) {
      return 0;
    }
    uVar4 = *(ulong *)(in_RSI + (ulong)local_1c * 8) >> 6;
    uVar1 = *(ulong *)(in_RSI + (ulong)local_1c * 8);
    uVar3 = (uint)uVar1 & 0x3f;
    sVar7 = (sbyte)uVar3;
    if (uVar4 >> sVar7 != 0) {
      return 0x17;
    }
    if (uVar3 < 0xf) {
      if ((uVar1 & 0x3f) != 0) {
        local_68 = (uint *)(in_R8 + (uVar4 << (0xeU - sVar7 & 0x3f)) * 0x10);
        for (local_70 = 1L << (0xeU - sVar7 & 0x3f); local_70 != 0; local_70 = local_70 + -1) {
          if ((*local_68 != 0) || (*(long *)(local_68 + 2) != 0)) {
            return 0x17;
          }
          *local_68 = uVar3;
          local_68[1] = local_1c;
          local_68 = local_68 + 4;
        }
      }
    }
    else {
      piVar5 = (int *)(in_R8 + (uVar4 >> (sVar7 - 0xeU & 0x3f)) * 0x10);
      if (*piVar5 != 0) {
        return 0x17;
      }
      piVar5[1] = piVar5[1] + 1;
      if (*(long *)(piVar5 + 2) == 0) {
        uVar6 = (*local_78)(4);
        *(undefined8 *)(piVar5 + 2) = uVar6;
      }
      else {
        lVar2 = *(long *)(piVar5 + 2);
        uVar6 = (*local_78)((ulong)(uint)piVar5[1] << 2);
        *(undefined8 *)(piVar5 + 2) = uVar6;
        if (*(long *)(piVar5 + 2) != 0) {
          for (local_5c = 0; local_5c < piVar5[1] - 1U; local_5c = local_5c + 1) {
            *(undefined4 *)(*(long *)(piVar5 + 2) + (ulong)local_5c * 4) =
                 *(undefined4 *)(lVar2 + (ulong)local_5c * 4);
          }
        }
        (*local_80)(lVar2);
      }
      if (*(long *)(piVar5 + 2) == 0) {
        return 1;
      }
      *(uint *)(*(long *)(piVar5 + 2) + (ulong)(piVar5[1] - 1) * 4) = local_1c;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static exr_result_t
hufBuildDecTable (
    exr_const_context_t pctxt,
    const uint64_t*     hcode,
    uint32_t            im,
    uint32_t            iM,
    HufDec*             hdecod)
{
    void* (*alloc_fn) (size_t) = pctxt ? pctxt->alloc_fn : internal_exr_alloc;
    void (*free_fn) (void*)    = pctxt ? pctxt->free_fn : internal_exr_free;

    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
        uint64_t c = hufCode (hcode[im]);
        int      l = hufLength (hcode[im]);

        if (c >> l)
        {
            //
            // Error: c is supposed to be an l-bit code,
            // but c contains a value that is greater
            // than the largest l-bit number.
            //

            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (l > HUF_DECBITS)
        {
            //
            // Long code: add a secondary entry
            //

            HufDec* pl = hdecod + (c >> (l - HUF_DECBITS));

            if (pl->len)
            {
                //
                // Error: a short code has already
                // been stored in table entry *pl.
                //

                return EXR_ERR_CORRUPT_CHUNK;
            }

            pl->lit++;

            if (pl->p)
            {
                uint32_t* p = pl->p;
                pl->p = (uint32_t*) alloc_fn (sizeof (uint32_t) * pl->lit);

                if (pl->p)
                {
                    for (uint32_t i = 0; i < pl->lit - 1; ++i)
                        pl->p[i] = p[i];
                }

                free_fn (p);
            }
            else { pl->p = (uint32_t*) alloc_fn (sizeof (uint32_t)); }

            if (!pl->p) return EXR_ERR_OUT_OF_MEMORY;

            pl->p[pl->lit - 1] = im;
        }
        else if (l)
        {
            //
            // Short code: init all primary entries
            //

            HufDec* pl = hdecod + (c << (HUF_DECBITS - l));

            for (uint64_t i = ((uint64_t) 1) << (HUF_DECBITS - l); i > 0;
                 i--, pl++)
            {
                if (pl->len || pl->p)
                {
                    //
                    // Error: a short code or a long code has
                    // already been stored in table entry *pl.
                    //

                    return EXR_ERR_CORRUPT_CHUNK;
                }

                pl->len = (int32_t) l;
                pl->lit = im;
            }
        }
    }
    return EXR_ERR_SUCCESS;
}